

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::And(VirtualMachine *this)

{
  element_type *peVar1;
  bool bVar2;
  anon_union_8_6_52c89740_for_Variable_1 aVar3;
  Variable VVar4;
  Variable VVar5;
  Variable var;
  Variable var_00;
  
  VVar4 = popOpStack(this);
  var_00.field_1 = VVar4.field_1;
  VVar5 = popOpStack(this);
  var.field_1 = VVar5.field_1;
  var._4_4_ = 0;
  var.type = VVar5.type;
  bVar2 = booleanValueOfVariable(this,var);
  if (bVar2) {
    var_00._4_4_ = 0;
    var_00.type = VVar4.type;
    bVar2 = booleanValueOfVariable(this,var_00);
    aVar3.integerValue._1_7_ = 0;
    aVar3.boolValue = bVar2;
  }
  else {
    aVar3.integerValue = 0;
  }
  VVar4.field_1.integerValue = aVar3.integerValue;
  VVar4._0_8_ = 2;
  pushOpStack(this,VVar4);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::And() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  this->pushBoolean(
    this->booleanValueOfVariable(first)
    &&
    this->booleanValueOfVariable(second)
  );
  this->advance();
}